

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

_Bool cpool_foreach(Curl_easy *data,cpool *cpool,void *param,
                   _func_int_Curl_easy_ptr_connectdata_ptr_void_ptr *func)

{
  Curl_llist *list;
  int iVar1;
  Curl_hash_element *pCVar2;
  Curl_llist_node *n;
  connectdata *pcVar3;
  Curl_hash_iterator iter;
  Curl_hash_iterator CStack_48;
  
  Curl_hash_start_iterate(&cpool->dest2bundle,&CStack_48);
  pCVar2 = Curl_hash_next_element(&CStack_48);
  do {
    if (pCVar2 == (Curl_hash_element *)0x0) {
      return false;
    }
    list = (Curl_llist *)pCVar2->ptr;
    pCVar2 = Curl_hash_next_element(&CStack_48);
    n = Curl_llist_head(list);
    while (n != (Curl_llist_node *)0x0) {
      pcVar3 = (connectdata *)Curl_node_elem(n);
      n = Curl_node_next(n);
      iVar1 = (*func)(data,pcVar3,param);
      if (iVar1 == 1) {
        return true;
      }
    }
  } while( true );
}

Assistant:

static bool cpool_foreach(struct Curl_easy *data,
                          struct cpool *cpool,
                          void *param,
                          int (*func)(struct Curl_easy *data,
                                      struct connectdata *conn, void *param))
{
  struct Curl_hash_iterator iter;
  struct Curl_hash_element *he;

  if(!cpool)
    return FALSE;

  Curl_hash_start_iterate(&cpool->dest2bundle, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    struct Curl_llist_node *curr;
    struct cpool_bundle *bundle = he->ptr;
    he = Curl_hash_next_element(&iter);

    curr = Curl_llist_head(&bundle->conns);
    while(curr) {
      /* Yes, we need to update curr before calling func(), because func()
         might decide to remove the connection */
      struct connectdata *conn = Curl_node_elem(curr);
      curr = Curl_node_next(curr);

      if(1 == func(data, conn, param)) {
        return TRUE;
      }
    }
  }
  return FALSE;
}